

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sine.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Sine::ArchiveOUT(ChFunction_Sine *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Sine>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30 = &this->amp;
  local_38 = "amp";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->phase;
  local_38 = "phase";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->freq;
  local_38 = "freq";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Sine::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Sine>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(amp);
    marchive << CHNVP(phase);
    marchive << CHNVP(freq);
}